

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  Pubkey local_100;
  Privkey local_e8;
  ExtPubkey local_c8;
  ByteData *local_28;
  ByteData *finterprint_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list_local;
  ExtPrivkey *ext_privkey_local;
  KeyData *this_local;
  
  local_28 = finterprint;
  finterprint_local = (ByteData *)child_num_list;
  child_num_list_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)this;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_,(ExtPrivkey *)child_num_list_local);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->path_,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)finterprint_local);
  ByteData::ByteData(&this->fingerprint_,local_28);
  ExtPrivkey::GetExtPubkey(&local_c8,(ExtPrivkey *)child_num_list_local);
  ExtPubkey::operator=(&this->extpubkey_,&local_c8);
  ExtPubkey::~ExtPubkey(&local_c8);
  Extkey::GetPrivkey(&local_e8,(Extkey *)child_num_list_local);
  Privkey::operator=(&this->privkey_,&local_e8);
  Privkey::~Privkey(&local_e8);
  Privkey::GetPubkey(&local_100,&this->privkey_);
  Pubkey::operator=(&this->pubkey_,&local_100);
  Pubkey::~Pubkey(&local_100);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey),
      path_(child_num_list),
      fingerprint_(finterprint) {
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}